

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

bool __thiscall kj::HttpHeaders::parseHeaders(HttpHeaders *this,char *ptr,char *end)

{
  byte *pbVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *unaff_R12;
  size_t unaff_R13;
  StringPtr value;
  StringPtr name;
  char *local_38;
  
  cVar2 = *ptr;
  while( true ) {
    if (cVar2 == '\0') {
      return ptr == end;
    }
    pcVar3 = ptr + -1;
    sVar4 = 0;
    pcVar5 = ptr;
    do {
      pcVar5 = pcVar5 + 1;
      pbVar1 = (byte *)(pcVar3 + 1);
      pcVar3 = pcVar3 + 1;
      sVar4 = sVar4 + 1;
      pcVar6 = pcVar3;
    } while ((*(ulong *)((anonymous_namespace)::HTTP_HEADER_NAME_CHARS + (ulong)(*pbVar1 >> 6) * 8)
              >> ((ulong)*pbVar1 & 0x3f) & 1) != 0);
    for (; (cVar2 = *pcVar6, cVar2 == ' ' || (cVar2 == '\t')); pcVar6 = pcVar6 + 1) {
      pcVar5 = pcVar5 + 1;
    }
    local_38 = ptr;
    if (cVar2 == ':' && sVar4 != 1) {
      for (; (*pcVar5 == ' ' || (*pcVar5 == '\t')); pcVar5 = pcVar5 + 1) {
      }
      *pcVar3 = '\0';
      unaff_R12 = ptr;
      unaff_R13 = sVar4;
      local_38 = pcVar5;
    }
    if (cVar2 != ':' || sVar4 == 1) break;
    value = consumeLine(&local_38);
    name.content.size_ = unaff_R13;
    name.content.ptr = unaff_R12;
    addNoCheck(this,name,value);
    cVar2 = *local_38;
    ptr = local_38;
  }
  return false;
}

Assistant:

bool HttpHeaders::parseHeaders(char* ptr, char* end) {
  while (*ptr != '\0') {
    KJ_IF_SOME(name, consumeHeaderName(ptr)) {
      kj::StringPtr line = consumeLine(ptr);
      addNoCheck(name, line);
    } else {
      return false;
    }
  }

  return ptr == end;
}